

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualStringMappedVector.hpp
# Opt level: O3

BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> * __thiscall
gmlc::containers::
DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::find
          (BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>
           *__return_storage_ptr__,
          DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
          *this,GlobalFederateId *searchValue)

{
  long lVar1;
  uint uVar2;
  const_iterator cVar3;
  FedInfo **ppFVar4;
  int iVar5;
  FedInfo *pFVar6;
  
  cVar3 = std::
          _Hashtable<helics::GlobalFederateId,_std::pair<const_helics::GlobalFederateId,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalFederateId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalFederateId>,_std::hash<helics::GlobalFederateId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->lookup2)._M_h,searchValue);
  if (cVar3.
      super__Node_iterator_base<std::pair<const_helics::GlobalFederateId,_unsigned_long>,_false>.
      _M_cur == (__node_type *)0x0) {
    iVar5 = (this->dataStorage).bsize;
    ppFVar4 = (this->dataStorage).dataptr;
    if ((long)iVar5 == 0x20) {
      if (ppFVar4 == (FedInfo **)0x0) {
        ppFVar4 = (FedInfo **)
                  &StableBlockVector<helics::FedInfo,5u,std::allocator<helics::FedInfo>>::end()::
                   emptyValue;
      }
      else {
        ppFVar4 = ppFVar4 + (long)(this->dataStorage).dataSlotIndex + 1;
      }
      pFVar6 = *ppFVar4;
      iVar5 = 0;
    }
    else {
      ppFVar4 = ppFVar4 + (this->dataStorage).dataSlotIndex;
      pFVar6 = *ppFVar4 + iVar5;
    }
    __return_storage_ptr__->vec = ppFVar4;
    __return_storage_ptr__->ptr = pFVar6;
    __return_storage_ptr__->offset = iVar5;
    return __return_storage_ptr__;
  }
  if ((this->dataStorage).csize == 0) {
    iVar5 = (this->dataStorage).bsize;
    ppFVar4 = (this->dataStorage).dataptr;
    if ((long)iVar5 != 0x20) {
      ppFVar4 = ppFVar4 + (this->dataStorage).dataSlotIndex;
      pFVar6 = *ppFVar4 + iVar5;
      goto LAB_00307cb1;
    }
    if (ppFVar4 == (FedInfo **)0x0) {
      ppFVar4 = (FedInfo **)
                &StableBlockVector<helics::FedInfo,5u,std::allocator<helics::FedInfo>>::end()::
                 emptyValue;
    }
    else {
      ppFVar4 = ppFVar4 + (long)(this->dataStorage).dataSlotIndex + 1;
    }
  }
  else {
    ppFVar4 = (this->dataStorage).dataptr;
  }
  pFVar6 = *ppFVar4;
  iVar5 = 0;
LAB_00307cb1:
  lVar1 = *(long *)((long)cVar3.
                          super__Node_iterator_base<std::pair<const_helics::GlobalFederateId,_unsigned_long>,_false>
                          ._M_cur + 0x10);
  __return_storage_ptr__->vec = ppFVar4;
  __return_storage_ptr__->ptr = pFVar6 + lVar1;
  uVar2 = (int)lVar1 + iVar5;
  __return_storage_ptr__->offset = uVar2;
  if (0x1f < (int)uVar2) {
    __return_storage_ptr__->vec = ppFVar4 + (ulong)(uVar2 - 0x20 >> 5) + 1;
    __return_storage_ptr__->offset = uVar2 & 0x1f;
    __return_storage_ptr__->ptr =
         (FedInfo *)
         ((long)&ppFVar4[(ulong)(uVar2 - 0x20 >> 5) + 1]->fed + (ulong)((uVar2 & 0x1f) << 4));
  }
  return __return_storage_ptr__;
}

Assistant:

auto find(const searchType2& searchValue) const
        {
            auto fnd = lookup2.find(searchValue);
            if (fnd != lookup2.end()) {
                return dataStorage.begin() + fnd->second;
            }
            return dataStorage.end();
        }